

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

CallIndirect * __thiscall
wasm::I64ToI32Lowering::visitGenericCall<wasm::CallIndirect>
          (I64ToI32Lowering *this,CallIndirect *curr,BuilderFunc<wasm::CallIndirect> *callBuilder)

{
  size_t sVar1;
  Builder *pBVar2;
  Type __args_1;
  bool bVar3;
  bool bVar4;
  Index IVar5;
  Expression **ppEVar6;
  CallIndirect *value;
  LocalSet *any;
  GlobalGet *value_00;
  LocalSet *append;
  LocalGet *args_00;
  Block *e_00;
  CallIndirect *expression;
  Name name;
  undefined1 auStack_b8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  undefined1 local_98 [8];
  TempVar lowBits;
  undefined1 local_60 [8];
  TempVar highBits;
  Expression *local_38;
  Expression *e;
  
  bVar3 = handleUnreachable(this,(Expression *)curr);
  if (bVar3) {
    value = (CallIndirect *)0x0;
  }
  else {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    highBits.idx = 0;
    highBits._4_4_ = 0;
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    bVar3 = false;
    local_60 = (undefined1  [8])&curr->operands;
    highBits.ty.id = (uintptr_t)callBuilder;
    while ((highBits._0_8_ != sVar1 || (local_60 != (undefined1  [8])&curr->operands))) {
      ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_60);
      local_38 = *ppEVar6;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_b8,
                 &local_38);
      bVar4 = hasOutParam(this,local_38);
      if (bVar4) {
        fetchOutParam((TempVar *)local_98,this,local_38);
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_98);
        lowBits.ty.id = (uintptr_t)Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_b8,
                   (Expression **)&lowBits.ty);
        TempVar::~TempVar((TempVar *)local_98);
        bVar3 = true;
      }
      highBits._0_8_ = highBits._0_8_ + 1;
    }
    __args_1.id = (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id
    ;
    if (__args_1.id == 3) {
      getTemp((TempVar *)local_98,this,(Type)0x2);
      getTemp((TempVar *)local_60,this,(Type)0x2);
      value = std::
              function<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
              ::operator()((function<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
                            *)highBits.ty.id,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           auStack_b8,(Type)0x2);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_98);
      any = Builder::makeLocalSet(pBVar2,IVar5,(Expression *)value);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_60);
      name.super_IString.str._M_str = DAT_01174df8;
      name.super_IString.str._M_len = INT64_TO_32_HIGH_BITS;
      value_00 = Builder::makeGlobalGet
                           ((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,name,
                            (Type)0x2);
      append = Builder::makeLocalSet(pBVar2,IVar5,(Expression *)value_00);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_98);
      args_00 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
      e_00 = Builder::blockify<wasm::LocalGet*>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                        (Expression *)any,(Expression *)append,args_00);
      setOutParam(this,(Expression *)e_00,(TempVar *)local_60);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)e_00);
      TempVar::~TempVar((TempVar *)local_60);
      TempVar::~TempVar((TempVar *)local_98);
    }
    else {
      expression = std::
                   function<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
                   ::operator()((function<wasm::CallIndirect_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type)>
                                 *)highBits.ty.id,
                                (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                auStack_b8,__args_1);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      value = (CallIndirect *)0x0;
      if (bVar3) {
        value = expression;
      }
    }
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_b8);
  }
  return value;
}

Assistant:

T* visitGenericCall(T* curr, BuilderFunc<T> callBuilder) {
    if (handleUnreachable(curr)) {
      return nullptr;
    }
    bool fixed = false;
    std::vector<Expression*> args;
    for (auto* e : curr->operands) {
      args.push_back(e);
      if (hasOutParam(e)) {
        TempVar argHighBits = fetchOutParam(e);
        args.push_back(builder->makeLocalGet(argHighBits, Type::i32));
        fixed = true;
      }
    }
    if (curr->type != Type::i64) {
      auto* ret = callBuilder(args, curr->type);
      replaceCurrent(ret);
      return fixed ? ret : nullptr;
    }
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    auto* call = callBuilder(args, Type::i32);
    LocalSet* doCall = builder->makeLocalSet(lowBits, call);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits, builder->makeGlobalGet(INT64_TO_32_HIGH_BITS, Type::i32));
    LocalGet* getLow = builder->makeLocalGet(lowBits, Type::i32);
    Block* result = builder->blockify(doCall, setHigh, getLow);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
    return call;
  }